

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O2

pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
* __thiscall
dg::DODRanganath::compute
          (pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
           *__return_storage_ptr__,DODRanganath *this,CDGraph *graph)

{
  pointer puVar1;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  *ppVar2;
  bool bVar3;
  pointer puVar4;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var5;
  _Base_ptr p_Var6;
  pointer puVar7;
  CDGraph *__range3;
  ContainedType *m;
  ContainedType *p;
  CDNode *n;
  ResultT revCD;
  ResultT CD;
  _Head_base<0UL,_dg::CDNode_*,_false> local_d0;
  _Head_base<0UL,_dg::CDNode_*,_false> local_c8;
  CDNode *local_c0;
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  *local_b8;
  _Base_ptr local_b0;
  _Rb_tree_node_base *local_a8;
  pointer local_a0;
  pointer local_98;
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  local_90;
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = __return_storage_ptr__;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__detail::
  _Rehash_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)this,(long)(graph->_nodes).
                          super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(graph->_nodes).
                          super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_b0 = &(graph->_predicates)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = (graph->_predicates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (ppVar2 = local_b8, p_Var6 != local_b0) {
    local_c0 = *(CDNode **)(p_Var6 + 1);
    local_a0 = (graph->_nodes).
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (graph->_nodes).
             super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = p_Var6;
    while (puVar4 != local_a0) {
      local_d0._M_head_impl =
           (puVar4->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t.
           super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
           super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
      puVar1 = (graph->_nodes).
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_98 = puVar4;
      for (puVar7 = (graph->_nodes).
                    super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1
          ) {
        local_c8._M_head_impl =
             (puVar7->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t
             .super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
             super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
        if (local_c8._M_head_impl != local_d0._M_head_impl) {
          bVar3 = onallpaths(local_d0._M_head_impl,local_c8._M_head_impl,graph);
          if (bVar3) {
            bVar3 = onallpaths(local_c8._M_head_impl,local_d0._M_head_impl,graph);
            if (bVar3) {
              bVar3 = dependence(this,local_c0,local_c8._M_head_impl,local_d0._M_head_impl,graph);
              if (bVar3) {
                p_Var5 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                          *)std::
                            map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                            ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                                          *)&local_60,&local_d0._M_head_impl);
                std::
                _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                ::_M_insert_unique<dg::CDNode*const&>(p_Var5,&local_c0);
                p_Var5 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                          *)std::
                            map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                            ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                                          *)&local_60,&local_c8._M_head_impl);
                std::
                _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                ::_M_insert_unique<dg::CDNode*const&>(p_Var5,&local_c0);
                p_Var5 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                          *)std::
                            map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                            ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                                          *)&local_90,&local_c0);
                std::
                _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                ::_M_insert_unique<dg::CDNode*const&>(p_Var5,&local_d0._M_head_impl);
                p_Var5 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                          *)std::
                            map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                            ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                                          *)&local_90,&local_c0);
                std::
                _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                ::_M_insert_unique<dg::CDNode*const&>(p_Var5,&local_c0);
              }
            }
          }
        }
      }
      puVar4 = local_98 + 1;
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
  }
  std::
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_>
  ::
  pair<std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_&,_std::map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>_&,_true>
            (local_b8,(map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                       *)&local_60,
             (map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
              *)&local_90);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<dg::CDNode_*,_std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>,_std::_Select1st<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return ppVar2;
}

Assistant:

std::pair<ResultT, ResultT> compute(CDGraph &graph) {
        ResultT CD;
        ResultT revCD;

        DBG(cda, "Computing DOD (Ranganath)");

        data.reserve(graph.size());

        for (auto *n : graph.predicates()) {
            for (auto *m : graph) {
                for (auto *p : graph) {
                    if (p == m) {
                        continue;
                    }

                    if (onallpaths(m, p, graph) && onallpaths(p, m, graph) &&
                        dependence(n, p, m, graph)) {
                        // DBG(cda, "DOD: " << n->getID() << " -> {"
                        //                 << p->getID() << ", " << m->getID()
                        //                 << "}");
                        CD[m].insert(n);
                        CD[p].insert(n);
                        revCD[n].insert(m);
                        revCD[n].insert(n);
                    }
                }
            }
        }

        return {CD, revCD};
    }